

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_unit.cpp
# Opt level: O1

void anon_unknown.dwarf_7e6f::test_art_iterator_next(void **param_1)

{
  unsigned_long uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  _Bool _Var4;
  allocator_type *__a;
  pointer pVVar5;
  pointer pVVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  initializer_list<unsigned_long> __l;
  initializer_list<std::array<unsigned_char,_6UL>_> __l_00;
  initializer_list<(anonymous_namespace)::Value> __l_01;
  vector<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_> keys;
  art_t art;
  vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_> values;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sizes;
  art_iterator_t iterator;
  vector<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_> local_118
  ;
  art_t local_100;
  vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_> local_f8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_d8;
  pointer local_c0;
  art_iterator_t local_b8;
  
  local_118.
  super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (array<unsigned_char,_6UL> *)0x0;
  local_118.
  super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (array<unsigned_char,_6UL> *)0x0;
  local_118.
  super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (array<unsigned_char,_6UL> *)0x0;
  local_f8.
  super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8.
  super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.depth = '0';
  local_b8.frame = '\0';
  local_b8._18_6_ = 0;
  local_b8.frames[0].node._0_2_ = 0x100;
  local_b8.frames[0].node._2_6_ = 0;
  local_b8.key[0] = '\x04';
  local_b8.key[1] = '\0';
  local_b8.key[2] = '\0';
  local_b8.key[3] = '\0';
  local_b8.key[4] = '\0';
  local_b8.key[5] = '\0';
  local_b8._6_2_ = 0;
  local_b8.value = (art_val_t *)0x10;
  __l._M_len = 4;
  __l._M_array = (iterator)&local_b8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_d8,__l,(allocator_type *)&local_100);
  if (local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar7 = 0;
    do {
      uVar1 = local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar7];
      if ((ulong)(byte)uVar1 != 0) {
        pVVar5 = (pointer)0x0;
        uVar8 = 0;
        do {
          uVar3 = local_b8._0_8_;
          local_b8.key._0_4_ = (uint)(byte)uVar7 << 0x18;
          uVar2 = local_b8.key._0_4_;
          local_b8._6_2_ = SUB82(uVar3,6);
          local_b8.key = (art_key_chunk_t  [6])((uint6)CONCAT11((byte)uVar8,(byte)uVar7) << 0x18);
          uVar3 = local_b8._0_8_;
          if (local_118.
              super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_118.
              super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<std::array<unsigned_char,6ul>,std::allocator<std::array<unsigned_char,6ul>>>
            ::_M_realloc_insert<std::array<unsigned_char,6ul>>
                      ((vector<std::array<unsigned_char,6ul>,std::allocator<std::array<unsigned_char,6ul>>>
                        *)&local_118,
                       (iterator)
                       local_118.
                       super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       (array<unsigned_char,_6UL> *)&local_b8);
          }
          else {
            local_b8.key[5] = '\0';
            local_b8.key[4] = (byte)uVar8;
            *(undefined2 *)
             ((local_118.
               super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->_M_elems + 4) = local_b8.key._4_2_;
            *(undefined4 *)
             (local_118.
              super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)->_M_elems = uVar2;
            local_118.
            super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_118.
                 super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
            local_b8._0_8_ = uVar3;
          }
          local_b8.value = (art_val_t *)pVVar5;
          std::vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>::
          push_back(&local_f8,(value_type *)&local_b8);
          uVar8 = uVar8 + 1;
          pVVar5 = (pointer)((pVVar5->super_art_val_t).key + uVar7);
        } while ((byte)uVar1 != uVar8);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < (ulong)((long)local_d8.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_d8.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  local_100.root = (art_node_t *)0x0;
  if (local_118.
      super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_118.
      super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar9 = 0;
    uVar7 = 0;
    pVVar5 = local_f8.
             super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      art_insert(&local_100,
                 (local_118.
                  super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar9,(art_val_t *)pVVar5);
      assert_art_valid((art_t *)&local_100);
      uVar7 = uVar7 + 1;
      lVar9 = lVar9 + 6;
      pVVar5 = pVVar5 + 1;
    } while (uVar7 < (ulong)(((long)local_118.
                                    super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_118.
                                    super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 1) *
                            -0x5555555555555555));
  }
  art_init_iterator(&local_b8,&local_100,true);
  lVar9 = 0;
  local_c0 = local_f8.
             super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
             ._M_impl.super__Vector_impl_data._M_start;
  pVVar5 = local_f8.
           super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    assert_key_eq(local_b8.key,
                  (local_118.
                   super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar9);
    _assert_true((ulong)(pVVar5 == (pointer)local_b8.value),"iterator.value == &values[i]",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
                 ,0xee);
    _Var4 = art_iterator_next(&local_b8);
    pVVar5 = pVVar5 + 1;
    lVar9 = lVar9 + 6;
  } while (_Var4);
  art_free(&local_100);
  pVVar5 = local_c0;
  if (local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (pVVar5 != (pointer)0x0) {
    operator_delete(pVVar5);
  }
  if (local_118.
      super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (array<unsigned_char,_6UL> *)0x0) {
    operator_delete(local_118.
                    super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  local_b8.frames[0].index_in_node = '\0';
  local_b8.frames[0]._9_1_ = 0;
  local_b8.frames[0]._10_6_ = 0x10000;
  local_b8.frames[1].node._0_2_ = 0;
  local_b8.depth = '\x01';
  local_b8.frame = '\0';
  local_b8._18_6_ = 0x1000000;
  local_b8.frames[0].node._0_2_ = 0;
  local_b8.frames[0].node._2_6_ = 0x10000000001;
  local_b8.key[0] = '\0';
  local_b8.key[1] = '\0';
  local_b8.key[2] = '\0';
  local_b8.key[3] = '\0';
  local_b8.key[4] = '\0';
  local_b8.key[5] = '\0';
  local_b8._6_2_ = 0;
  local_b8.value = (art_val_t *)0x1000000;
  __a = (allocator_type *)&local_f8;
  __l_00._M_len = 7;
  __l_00._M_array = (iterator)&local_b8;
  std::vector<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>::
  vector(&local_118,__l_00,__a);
  local_b8.value = (art_val_t *)0x0;
  local_b8.frames[0].node._0_2_ = 1;
  local_b8.frames[0].node._2_6_ = 0;
  local_b8.frames[1].node._0_2_ = 2;
  local_b8.frames[1].node._2_6_ = 0;
  local_b8.frames[2].node = (art_node_t *)0x3;
  local_b8.frames[3].node = (art_node_t *)0x4;
  local_b8.frames[4].node = (art_node_t *)0x5;
  local_b8.frames[5].node = (art_node_t *)0x6;
  __l_01._M_len = 7;
  __l_01._M_array = (iterator)&local_b8;
  std::vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>::vector
            (&local_f8,__l_01,(allocator_type *)__a);
  local_d8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  if (local_118.
      super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_118.
      super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar9 = 0;
    uVar7 = 0;
    pVVar5 = local_f8.
             super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      art_insert((art_t *)&local_d8,
                 (local_118.
                  super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar9,(art_val_t *)pVVar5);
      assert_art_valid((art_t *)&local_d8);
      uVar7 = uVar7 + 1;
      lVar9 = lVar9 + 6;
      pVVar5 = pVVar5 + 1;
    } while (uVar7 < (ulong)(((long)local_118.
                                    super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_118.
                                    super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 1) *
                            -0x5555555555555555));
  }
  art_init_iterator(&local_b8,(art_t *)&local_d8,true);
  pVVar5 = local_f8.
           super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar9 = 0;
  pVVar6 = local_f8.
           super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    assert_key_eq(local_b8.key,
                  (local_118.
                   super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar9);
    _assert_true((ulong)(pVVar6 == (pointer)local_b8.value),"iterator.value == &values[i]",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
                 ,0x105);
    _Var4 = art_iterator_next(&local_b8);
    pVVar6 = pVVar6 + 1;
    lVar9 = lVar9 + 6;
  } while (_Var4);
  art_free((art_t *)&local_d8);
  if (pVVar5 != (pointer)0x0) {
    operator_delete(pVVar5);
  }
  if (local_118.
      super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (array<unsigned_char,_6UL> *)0x0) {
    operator_delete(local_118.
                    super__Vector_base<std::array<unsigned_char,_6UL>,_std::allocator<std::array<unsigned_char,_6UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void erase(Key key) {
        art_erase(&art_, key.data());
        shadow_.erase(key);
    }